

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall dgPolyhedra::RefineTriangulation(dgPolyhedra *this,HaF64 *vertex,HaI32 stride)

{
  dgEdge *pdVar1;
  dgPolyhedra *this_00;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  dgBigVector normal;
  dgEdge *edgePerimeters [16384];
  Iterator IStack_20058;
  dgBigVector dStack_20048;
  dgEdge *apdStack_20028 [16384];
  
  this_00 = (dgPolyhedra *)vertex;
  IStack_20058.m_tree = &this->super_dgTree<dgEdge,_long>;
  IStack_20058.m_ptr =
       &dgTree<dgEdge,_long>::Minimum(&this->super_dgTree<dgEdge,_long>)->super_dgRedBackNode;
  while( true ) {
    if ((dgTreeNode *)IStack_20058.m_ptr == (dgTreeNode *)0x0) {
      __assert_fail("perimeterCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                    ,0xd31,
                    "void dgPolyhedra::RefineTriangulation(const hacd::HaF64 *const, hacd::HaI32)");
    }
    if (((dgEdge *)((long)IStack_20058.m_ptr + 0x28))->m_incidentFace < 0) break;
    this_00 = (dgPolyhedra *)0x0;
    dgTree<dgEdge,_long>::Iterator::operator++(&IStack_20058,0);
  }
  lVar2 = 0;
  pdVar1 = (dgEdge *)((long)IStack_20058.m_ptr + 0x28);
  do {
    apdStack_20028[lVar2] = pdVar1->m_twin;
    if (lVar2 == 0x3fff) {
      __assert_fail("perimeterCount < hacd::HaI32 (sizeof (edgePerimeters) / sizeof (edgePerimeters[0]))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                    ,0xd2b,
                    "void dgPolyhedra::RefineTriangulation(const hacd::HaF64 *const, hacd::HaI32)");
    }
    pdVar1 = pdVar1->m_prev;
    lVar2 = lVar2 + 1;
  } while (pdVar1 != (dgEdge *)((long)IStack_20058.m_ptr + 0x28));
  apdStack_20028[lVar2] = apdStack_20028[0];
  FaceNormal(&dStack_20048,this_00,apdStack_20028[0],vertex,stride * 8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dStack_20048.super_dgTemplateVector<double>.m_x;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dStack_20048.super_dgTemplateVector<double>.m_z;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dStack_20048.super_dgTemplateVector<double>.m_y *
                 dStack_20048.super_dgTemplateVector<double>.m_y;
  auVar3 = vfmadd231sd_fma(auVar4,auVar3,auVar3);
  auVar3 = vfmadd213sd_fma(auVar5,auVar5,auVar3);
  if (9.999999960041972e-13 < auVar3._0_8_) {
    RefineTriangulation(this,vertex,stride,&dStack_20048,(HaI32)lVar2,apdStack_20028);
  }
  return;
}

Assistant:

void dgPolyhedra::RefineTriangulation (const hacd::HaF64* const vertex, hacd::HaI32 stride)
{
	dgEdge* edgePerimeters[1024 * 16];
	hacd::HaI32 perimeterCount = 0;

	dgPolyhedra::Iterator iter (*this);
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (edge->m_incidentFace < 0) {
			dgEdge* ptr = edge;
			do {
				edgePerimeters[perimeterCount] = ptr->m_twin;
				perimeterCount ++;
				HACD_ASSERT (perimeterCount < hacd::HaI32 (sizeof (edgePerimeters) / sizeof (edgePerimeters[0])));
				ptr = ptr->m_prev;
			} while (ptr != edge);
			break;
		}
	}
	HACD_ASSERT (perimeterCount);
	HACD_ASSERT (perimeterCount < hacd::HaI32 (sizeof (edgePerimeters) / sizeof (edgePerimeters[0])));
	edgePerimeters[perimeterCount] = edgePerimeters[0];

	dgBigVector normal (FaceNormal(edgePerimeters[0], vertex, hacd::HaI32 (stride * sizeof (hacd::HaF64))));
	if ((normal % normal) > hacd::HaF32 (1.0e-12f)) {
		RefineTriangulation (vertex, stride, &normal, perimeterCount, edgePerimeters);
	}
}